

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::_impl::
map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>const&,____C_A_T_C_H____T_E_S_T____28()::__0&>
          (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,_impl *this,
          strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
          *t,anon_class_1_0_00000001 *fn)

{
  anon_class_1_0_00000001 *fn_local;
  strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
  *t_local;
  
  map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,ezy::features::result_adapter<std::variant<int,std::__cxx11::string>>,ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>const&,____C_A_T_C_H____T_E_S_T____28()::__0&>
            (__return_storage_ptr__,this,t,fn);
  return __return_storage_ptr__;
}

Assistant:

static constexpr decltype(auto) map(ST&& t, Fn&& fn)
        {
          using dST = ezy::remove_cvref_t<ST>;
          using trait = Adapter<typename dST::type>;

          // TODO static_assert(std::is_invocable_v<Fn(success_type)>, "Fn must be invocable with success_type");
          using fn_result_type = decltype(ezy::invoke(fn, std::declval<typename trait::success_type>()));

          using R = typename trait::template rebind_success_t<fn_result_type>;
          using new_trait = Adapter<R>;
          using return_type = rebind_strong_type_t<dST, R>;

          return map<return_type, new_trait>(std::forward<ST>(t), std::forward<Fn>(fn));
        }